

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportTable
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index table_index,Type elem_type,Limits *elem_limits)

{
  Module *this_00;
  bool bVar1;
  pointer pTVar2;
  Location local_70;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_50;
  undefined1 local_48 [8];
  __single_object import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderIR *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
  .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
  super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_ = import_index;
  std::make_unique<wabt::TableImport>();
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pTVar2->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pTVar2->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                      local_48);
  (pTVar2->table).elem_limits.initial = elem_limits->initial;
  (pTVar2->table).elem_limits.max = elem_limits->max;
  bVar1 = elem_limits->is_shared;
  (pTVar2->table).elem_limits.has_max = elem_limits->has_max;
  (pTVar2->table).elem_limits.is_shared = bVar1;
  (pTVar2->table).elem_limits.is_64 = elem_limits->is_64;
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                      local_48);
  (pTVar2->table).elem_type = elem_type;
  this_00 = this->module_;
  GetLocation(&local_70,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
            ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)&local_50,
             (Location *)local_48);
  Module::AppendField(this_00,&local_50);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_50);
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
            ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)local_48);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportTable(Index import_index,
                                     std::string_view module_name,
                                     std::string_view field_name,
                                     Index table_index,
                                     Type elem_type,
                                     const Limits* elem_limits) {
  auto import = std::make_unique<TableImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->table.elem_limits = *elem_limits;
  import->table.elem_type = elem_type;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}